

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void MakeChild(NODE_conflict Parent,UINT8 CharC,NODE_conflict Child)

{
  int iVar1;
  int iVar2;
  NODE_conflict Node2;
  NODE_conflict Node1;
  NODE_conflict Child_local;
  UINT8 CharC_local;
  NODE_conflict Parent_local;
  
  iVar2 = Parent + (uint)CharC * 0x400 + 0x100000;
  iVar1 = mNext[iVar2];
  mNext[iVar2] = Child;
  mNext[Child] = iVar1;
  mPrev[iVar1] = Child;
  mPrev[Child] = iVar2;
  mParent[Child] = Parent;
  mChildCount[Parent] = mChildCount[Parent] + '\x01';
  return;
}

Assistant:

STATIC
  VOID
  MakeChild (
  NODE  Parent,
  UINT8 CharC,
  NODE  Child
  )
  /*++

  Routine Description:

  Create a new child for a given parent node.

  Arguments:

  Parent       - the parent node
  CharC   - the edge character
  Child       - the child node

  Returns: (VOID)

  --*/
{
  NODE  Node1;
  NODE  Node2;

  Node1           = (NODE) HASH (Parent, CharC);
  Node2           = mNext[Node1];
  mNext[Node1]    = Child;
  mNext[Child]    = Node2;
  mPrev[Node2]    = Child;
  mPrev[Child]    = Node1;
  mParent[Child]  = Parent;
  mChildCount[Parent]++;
}